

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

reference * __thiscall
mjs::interpreter::impl::scope::lookup(reference *__return_storage_ptr__,scope *this,wstring *id)

{
  gc_heap *h;
  wstring_view local_40;
  string local_30;
  wstring *local_20;
  wstring *id_local;
  scope *this_local;
  
  h = this->heap_;
  local_20 = id;
  id_local = (wstring *)this;
  this_local = (scope *)__return_storage_ptr__;
  local_40 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)id);
  string::string(&local_30,h,&local_40);
  lookup(__return_storage_ptr__,this,&local_30);
  string::~string(&local_30);
  return __return_storage_ptr__;
}

Assistant:

reference lookup(const std::wstring& id) const {
            return lookup(string{heap_, id});
        }